

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::CompactMemTable(DBImpl *this)

{
  Version *this_00;
  undefined8 uVar1;
  Status s;
  VersionEdit edit;
  undefined1 local_e8 [24];
  Comparator *local_d0;
  Slice local_c8;
  undefined1 local_b8 [66];
  bool local_76;
  
  if (this->imm_ == (MemTable *)0x0) {
    __assert_fail("imm_ != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                  ,0x218,"void leveldb::DBImpl::CompactMemTable()");
  }
  VersionEdit::VersionEdit((VersionEdit *)local_b8);
  this_00 = this->versions_->current_;
  Version::Ref(this_00);
  WriteLevel0Table((DBImpl *)local_e8,(MemTable *)this,(VersionEdit *)this->imm_,(Version *)local_b8
                  );
  Version::Unref(this_00);
  if ((_func_int **)local_e8._0_8_ == (_func_int **)0x0) {
    if (((this->shutting_down_)._M_base._M_i & 1U) != 0) {
      local_e8._16_8_ = "Deleting DB during memtable compaction";
      local_d0 = (Comparator *)0x26;
      local_c8.data_ = "";
      local_c8.size_ = 0;
      Status::IOError((Status *)(local_e8 + 8),(Slice *)(local_e8 + 0x10),&local_c8);
      uVar1 = local_e8._0_8_;
      local_e8._0_8_ = local_e8._8_8_;
      local_e8._8_8_ = uVar1;
      Status::~Status((Status *)(local_e8 + 8));
    }
    if ((_func_int **)local_e8._0_8_ == (_func_int **)0x0) {
      local_76 = true;
      local_b8._40_8_ = (pointer)0x0;
      local_b8._32_8_ = this->logfile_number_;
      local_b8[0x41] = true;
      VersionSet::LogAndApply
                ((VersionSet *)(local_e8 + 0x10),(VersionEdit *)this->versions_,(Mutex *)local_b8);
      uVar1 = local_e8._0_8_;
      local_e8._0_8_ = local_e8._16_8_;
      local_e8._16_8_ = uVar1;
      Status::~Status((Status *)(local_e8 + 0x10));
      if ((_func_int **)local_e8._0_8_ == (_func_int **)0x0) {
        MemTable::Unref(this->imm_);
        this->imm_ = (MemTable *)0x0;
        (this->has_imm_)._M_base._M_i = false;
        DeleteObsoleteFiles(this);
        goto LAB_001097d3;
      }
    }
  }
  RecordBackgroundError(this,(Status *)local_e8);
LAB_001097d3:
  Status::~Status((Status *)local_e8);
  VersionEdit::~VersionEdit((VersionEdit *)local_b8);
  return;
}

Assistant:

void DBImpl::CompactMemTable() {
  mutex_.AssertHeld();
  assert(imm_ != nullptr);

  // Save the contents of the memtable as a new Table
  VersionEdit edit;
  Version* base = versions_->current();
  base->Ref();
  Status s = WriteLevel0Table(imm_, &edit, base);
  base->Unref();

  if (s.ok() && shutting_down_.load(std::memory_order_acquire)) {
    s = Status::IOError("Deleting DB during memtable compaction");
  }

  // Replace immutable memtable with the generated Table
  if (s.ok()) {
    edit.SetPrevLogNumber(0);
    edit.SetLogNumber(logfile_number_);  // Earlier logs no longer needed
    s = versions_->LogAndApply(&edit, &mutex_);
  }

  if (s.ok()) {
    // Commit to the new state
    imm_->Unref();
    imm_ = nullptr;
    has_imm_.store(false, std::memory_order_release);
    DeleteObsoleteFiles();
  } else {
    RecordBackgroundError(s);
  }
}